

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrfmt.cpp
# Opt level: O1

int32_t uprv_itou_63(UChar *buffer,int32_t capacity,uint32_t i,uint32_t radix,int32_t minwidth)

{
  short sVar1;
  UChar *pUVar2;
  ulong uVar3;
  UChar UVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  do {
    sVar1 = (short)((ulong)i % (ulong)radix);
    UVar4 = sVar1 + L'0';
    if (9 < (int)((ulong)i % (ulong)radix)) {
      UVar4 = sVar1 + L'7';
    }
    buffer[uVar6] = UVar4;
    uVar6 = uVar6 + 1;
  } while ((radix <= i) && (i = i / radix, (long)uVar6 < (long)capacity));
  if ((int)uVar6 < minwidth) {
    do {
      buffer[uVar6] = L'0';
      uVar6 = uVar6 + 1;
    } while ((uint)minwidth != uVar6);
  }
  uVar5 = (uint)uVar6;
  if ((int)uVar5 < capacity) {
    buffer[uVar6 & 0xffffffff] = L'\0';
  }
  if (1 < uVar5) {
    pUVar2 = buffer + (int)uVar5;
    uVar3 = 0;
    do {
      pUVar2 = pUVar2 + -1;
      UVar4 = *pUVar2;
      *pUVar2 = buffer[uVar3];
      buffer[uVar3] = UVar4;
      uVar3 = uVar3 + 1;
    } while ((uVar6 >> 1 & 0x7fffffff) != uVar3);
  }
  return uVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_itou (UChar * buffer, int32_t capacity,
           uint32_t i, uint32_t radix, int32_t minwidth)
{
    int32_t length = 0;
    int digit;
    int32_t j;
    UChar temp;

    do{
        digit = (int)(i % radix);
        buffer[length++]=(UChar)(digit<=9?(0x0030+digit):(0x0030+digit+7));
        i=i/radix;
    } while(i && length<capacity);

    while (length < minwidth){
        buffer[length++] = (UChar) 0x0030;/*zero padding */
    }
    /* null terminate the buffer */
    if(length<capacity){
        buffer[length] = (UChar) 0x0000;
    }

    /* Reverses the string */
    for (j = 0; j < (length / 2); j++){
        temp = buffer[(length-1) - j];
        buffer[(length-1) - j] = buffer[j];
        buffer[j] = temp;
    }
    return length;
}